

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Mish_x86_fma::forward_inplace(Mish_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float __x;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 (*pauVar7) [16];
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [32];
  long lVar12;
  float fVar13;
  v4sf one;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar49 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  undefined1 auVar45 [32];
  undefined1 auVar48 [32];
  undefined1 auVar50 [32];
  
  uVar8 = bottom_top_blob->c;
  uVar10 = (ulong)uVar8;
  uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar8) {
      auVar115 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                    CONCAT424(0x42b0c0a5,
                                              CONCAT420(0x42b0c0a5,
                                                        CONCAT416(0x42b0c0a5,
                                                                  CONCAT412(0x42b0c0a5,
                                                                            CONCAT48(0x42b0c0a5,
                                                                                                                                                                          
                                                  0x42b0c0a542b0c0a5)))))));
      auVar140 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar60._8_4_ = 0x3f000000;
      auVar60._0_8_ = 0x3f0000003f000000;
      auVar60._12_4_ = 0x3f000000;
      auVar60._16_4_ = 0x3f000000;
      auVar60._20_4_ = 0x3f000000;
      auVar60._24_4_ = 0x3f000000;
      auVar60._28_4_ = 0x3f000000;
      auVar102 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar93 = ZEXT3264(CONCAT428(0x3f800000,
                                   CONCAT424(0x3f800000,
                                             CONCAT420(0x3f800000,
                                                       CONCAT416(0x3f800000,
                                                                 CONCAT412(0x3f800000,
                                                                           CONCAT48(0x3f800000,
                                                                                                                                                                        
                                                  0x3f8000003f800000)))))));
      uVar5 = 0;
      auVar154 = ZEXT3264(CONCAT428(0x3f318000,
                                    CONCAT424(0x3f318000,
                                              CONCAT420(0x3f318000,
                                                        CONCAT416(0x3f318000,
                                                                  CONCAT412(0x3f318000,
                                                                            CONCAT48(0x3f318000,
                                                                                                                                                                          
                                                  0x3f3180003f318000)))))));
      auVar181._8_4_ = 0xb95e8083;
      auVar181._0_8_ = 0xb95e8083b95e8083;
      auVar181._12_4_ = 0xb95e8083;
      auVar181._16_4_ = 0xb95e8083;
      auVar181._20_4_ = 0xb95e8083;
      auVar181._24_4_ = 0xb95e8083;
      auVar181._28_4_ = 0xb95e8083;
      auVar167._8_4_ = 0x3ab743ce;
      auVar167._0_8_ = 0x3ab743ce3ab743ce;
      auVar167._12_4_ = 0x3ab743ce;
      auVar167._16_4_ = 0x3ab743ce;
      auVar167._20_4_ = 0x3ab743ce;
      auVar167._24_4_ = 0x3ab743ce;
      auVar167._28_4_ = 0x3ab743ce;
      auVar172._8_4_ = 0x39506967;
      auVar172._0_8_ = 0x3950696739506967;
      auVar172._12_4_ = 0x39506967;
      auVar172._16_4_ = 0x39506967;
      auVar172._20_4_ = 0x39506967;
      auVar172._24_4_ = 0x39506967;
      auVar172._28_4_ = 0x39506967;
      auVar127._8_4_ = 0x3c088908;
      auVar127._0_8_ = 0x3c0889083c088908;
      auVar127._12_4_ = 0x3c088908;
      auVar127._16_4_ = 0x3c088908;
      auVar127._20_4_ = 0x3c088908;
      auVar127._24_4_ = 0x3c088908;
      auVar127._28_4_ = 0x3c088908;
      auVar47._8_4_ = 0x3d2aa9c1;
      auVar47._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar47._12_4_ = 0x3d2aa9c1;
      auVar47._16_4_ = 0x3d2aa9c1;
      auVar47._20_4_ = 0x3d2aa9c1;
      auVar47._24_4_ = 0x3d2aa9c1;
      auVar47._28_4_ = 0x3d2aa9c1;
      auVar52 = ZEXT3264(CONCAT428(0x800000,CONCAT424(0x800000,CONCAT420(0x800000,CONCAT416(0x800000
                                                  ,CONCAT412(0x800000,CONCAT48(0x800000,
                                                  0x80000000800000)))))));
      do {
        if (0 < (int)uVar9) {
          pauVar11 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar8 = uVar9;
          do {
            auVar99 = *pauVar11;
            auVar17 = vminps_avx(auVar115._0_32_,auVar99);
            auVar28 = auVar140._0_32_;
            auVar44 = vmaxps_avx(auVar28,auVar17);
            auVar27 = auVar102._0_32_;
            auVar37 = vfmadd213ps_fma(auVar27,auVar44,auVar60);
            auVar41 = vroundps_avx(ZEXT1632(auVar37),1);
            auVar17 = vcmpps_avx(ZEXT1632(auVar37),auVar41,1);
            auVar17 = vandps_avx(auVar17,auVar93._0_32_);
            auVar17 = vsubps_avx(auVar41,auVar17);
            auVar45 = auVar154._0_32_;
            auVar37 = vfmsub231ps_fma(auVar44,auVar17,auVar45);
            auVar54 = vfnmsub231ps_fma(ZEXT1632(auVar37),auVar17,auVar181);
            auVar16 = ZEXT1632(auVar54);
            auVar44._28_4_ = auVar41._28_4_;
            auVar44._0_28_ =
                 ZEXT1628(CONCAT412(auVar54._12_4_ * auVar54._12_4_,
                                    CONCAT48(auVar54._8_4_ * auVar54._8_4_,
                                             CONCAT44(auVar54._4_4_ * auVar54._4_4_,
                                                      auVar54._0_4_ * auVar54._0_4_))));
            auVar37 = vfmadd213ps_fma(auVar172,auVar16,auVar167);
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar16,auVar127);
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar16,auVar47);
            auVar157._8_4_ = 0x3e2aaaaa;
            auVar157._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar157._12_4_ = 0x3e2aaaaa;
            auVar157._16_4_ = 0x3e2aaaaa;
            auVar157._20_4_ = 0x3e2aaaaa;
            auVar157._24_4_ = 0x3e2aaaaa;
            auVar157._28_4_ = 0x3e2aaaaa;
            auVar41 = ZEXT1632(auVar54);
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar41,auVar157);
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar41,auVar60);
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar44,auVar41);
            auVar143._0_4_ = auVar37._0_4_ + auVar93._0_4_;
            auVar143._4_4_ = auVar37._4_4_ + auVar93._4_4_;
            auVar143._8_4_ = auVar37._8_4_ + auVar93._8_4_;
            auVar143._12_4_ = auVar37._12_4_ + auVar93._12_4_;
            auVar143._16_4_ = auVar93._16_4_ + 0.0;
            auVar143._20_4_ = auVar93._20_4_ + 0.0;
            auVar143._24_4_ = auVar93._24_4_ + 0.0;
            auVar143._28_4_ = auVar93._28_4_ + 0.0;
            auVar37._0_4_ = (int)auVar17._0_4_;
            auVar37._4_4_ = (int)auVar17._4_4_;
            auVar37._8_4_ = (int)auVar17._8_4_;
            auVar37._12_4_ = (int)auVar17._12_4_;
            auVar42._16_4_ = (int)auVar17._16_4_;
            auVar42._0_16_ = auVar37;
            auVar42._20_4_ = (int)auVar17._20_4_;
            auVar42._24_4_ = (int)auVar17._24_4_;
            auVar42._28_4_ = (int)auVar17._28_4_;
            auVar54 = vpslld_avx(auVar37,0x17);
            auVar37 = vpslld_avx(auVar42._16_16_,0x17);
            auVar148._8_4_ = 0x3f800000;
            auVar148._0_8_ = 0x3f8000003f800000;
            auVar148._12_4_ = 0x3f800000;
            auVar37 = vpaddd_avx(auVar148,auVar37);
            auVar150._8_4_ = 0x3f800000;
            auVar150._0_8_ = 0x3f8000003f800000;
            auVar150._12_4_ = 0x3f800000;
            auVar54 = vpaddd_avx(auVar150,auVar54);
            auVar43._16_16_ = auVar37;
            auVar43._0_16_ = auVar54;
            auVar148 = vfmadd213ps_fma(auVar43,auVar143,auVar93._0_32_);
            auVar17 = vmaxps_avx(ZEXT1632(auVar148),auVar52._0_32_);
            auVar54 = vpsrld_avx(auVar17._0_16_,0x17);
            auVar37 = vpsrld_avx(auVar17._16_16_,0x17);
            auVar16._8_4_ = 0x807fffff;
            auVar16._0_8_ = 0x807fffff807fffff;
            auVar16._12_4_ = 0x807fffff;
            auVar16._16_4_ = 0x807fffff;
            auVar16._20_4_ = 0x807fffff;
            auVar16._24_4_ = 0x807fffff;
            auVar16._28_4_ = 0x807fffff;
            auVar17 = vandps_avx(auVar17,auVar16);
            auVar41 = vorps_avx(auVar17,auVar60);
            auVar17._8_4_ = 0x3f3504f3;
            auVar17._0_8_ = 0x3f3504f33f3504f3;
            auVar17._12_4_ = 0x3f3504f3;
            auVar17._16_4_ = 0x3f3504f3;
            auVar17._20_4_ = 0x3f3504f3;
            auVar17._24_4_ = 0x3f3504f3;
            auVar17._28_4_ = 0x3f3504f3;
            auVar44 = vcmpps_avx(auVar17,auVar41,2);
            auVar17 = vandnps_avx(auVar44,auVar41);
            auVar86._0_4_ = auVar17._0_4_ + auVar41._0_4_ + -1.0;
            auVar86._4_4_ = auVar17._4_4_ + auVar41._4_4_ + -1.0;
            auVar86._8_4_ = auVar17._8_4_ + auVar41._8_4_ + -1.0;
            auVar86._12_4_ = auVar17._12_4_ + auVar41._12_4_ + -1.0;
            auVar86._16_4_ = auVar17._16_4_ + auVar41._16_4_ + -1.0;
            auVar86._20_4_ = auVar17._20_4_ + auVar41._20_4_ + -1.0;
            auVar86._24_4_ = auVar17._24_4_ + auVar41._24_4_ + -1.0;
            auVar86._28_4_ = auVar17._28_4_ + auVar41._28_4_ + -1.0;
            auVar37 = vpsubd_avx(auVar37,auVar44._16_16_);
            auVar78._8_4_ = 0xffffff81;
            auVar78._0_8_ = 0xffffff81ffffff81;
            auVar78._12_4_ = 0xffffff81;
            auVar37 = vpaddd_avx(auVar37,auVar78);
            auVar54 = vpsubd_avx(auVar54,auVar44._0_16_);
            auVar54 = vpaddd_avx(auVar54,auVar78);
            auVar144._16_16_ = auVar37;
            auVar144._0_16_ = auVar54;
            auVar153._0_4_ = auVar86._0_4_ * auVar86._0_4_;
            auVar153._4_4_ = auVar86._4_4_ * auVar86._4_4_;
            auVar153._8_4_ = auVar86._8_4_ * auVar86._8_4_;
            auVar153._12_4_ = auVar86._12_4_ * auVar86._12_4_;
            auVar153._16_4_ = auVar86._16_4_ * auVar86._16_4_;
            auVar153._20_4_ = auVar86._20_4_ * auVar86._20_4_;
            auVar153._24_4_ = auVar86._24_4_ * auVar86._24_4_;
            auVar153._28_4_ = 0;
            auVar158._8_4_ = 0x3d9021bb;
            auVar158._0_8_ = 0x3d9021bb3d9021bb;
            auVar158._12_4_ = 0x3d9021bb;
            auVar158._16_4_ = 0x3d9021bb;
            auVar158._20_4_ = 0x3d9021bb;
            auVar158._24_4_ = 0x3d9021bb;
            auVar158._28_4_ = 0x3d9021bb;
            auVar18._8_4_ = 0xbdebd1b8;
            auVar18._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar18._12_4_ = 0xbdebd1b8;
            auVar18._16_4_ = 0xbdebd1b8;
            auVar18._20_4_ = 0xbdebd1b8;
            auVar18._24_4_ = 0xbdebd1b8;
            auVar18._28_4_ = 0xbdebd1b8;
            auVar37 = vfmadd213ps_fma(auVar158,auVar86,auVar18);
            auVar19._8_4_ = 0x3def251a;
            auVar19._0_8_ = 0x3def251a3def251a;
            auVar19._12_4_ = 0x3def251a;
            auVar19._16_4_ = 0x3def251a;
            auVar19._20_4_ = 0x3def251a;
            auVar19._24_4_ = 0x3def251a;
            auVar19._28_4_ = 0x3def251a;
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar86,auVar19);
            auVar20._8_4_ = 0xbdfe5d4f;
            auVar20._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar20._12_4_ = 0xbdfe5d4f;
            auVar20._16_4_ = 0xbdfe5d4f;
            auVar20._20_4_ = 0xbdfe5d4f;
            auVar20._24_4_ = 0xbdfe5d4f;
            auVar20._28_4_ = 0xbdfe5d4f;
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar86,auVar20);
            auVar21._8_4_ = 0x3e11e9bf;
            auVar21._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar21._12_4_ = 0x3e11e9bf;
            auVar21._16_4_ = 0x3e11e9bf;
            auVar21._20_4_ = 0x3e11e9bf;
            auVar21._24_4_ = 0x3e11e9bf;
            auVar21._28_4_ = 0x3e11e9bf;
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar86,auVar21);
            auVar22._8_4_ = 0xbe2aae50;
            auVar22._0_8_ = 0xbe2aae50be2aae50;
            auVar22._12_4_ = 0xbe2aae50;
            auVar22._16_4_ = 0xbe2aae50;
            auVar22._20_4_ = 0xbe2aae50;
            auVar22._24_4_ = 0xbe2aae50;
            auVar22._28_4_ = 0xbe2aae50;
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar86,auVar22);
            auVar23._8_4_ = 0x3e4cceac;
            auVar23._0_8_ = 0x3e4cceac3e4cceac;
            auVar23._12_4_ = 0x3e4cceac;
            auVar23._16_4_ = 0x3e4cceac;
            auVar23._20_4_ = 0x3e4cceac;
            auVar23._24_4_ = 0x3e4cceac;
            auVar23._28_4_ = 0x3e4cceac;
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar86,auVar23);
            auVar24._8_4_ = 0xbe7ffffc;
            auVar24._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar24._12_4_ = 0xbe7ffffc;
            auVar24._16_4_ = 0xbe7ffffc;
            auVar24._20_4_ = 0xbe7ffffc;
            auVar24._24_4_ = 0xbe7ffffc;
            auVar24._28_4_ = 0xbe7ffffc;
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar86,auVar24);
            auVar25._8_4_ = 0x3eaaaaaa;
            auVar25._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar25._12_4_ = 0x3eaaaaaa;
            auVar25._16_4_ = 0x3eaaaaaa;
            auVar25._20_4_ = 0x3eaaaaaa;
            auVar25._24_4_ = 0x3eaaaaaa;
            auVar25._28_4_ = 0x3eaaaaaa;
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar86,auVar25);
            auVar159._0_4_ = auVar153._0_4_ * auVar86._0_4_ * auVar37._0_4_;
            auVar159._4_4_ = auVar153._4_4_ * auVar86._4_4_ * auVar37._4_4_;
            auVar159._8_4_ = auVar153._8_4_ * auVar86._8_4_ * auVar37._8_4_;
            auVar159._12_4_ = auVar153._12_4_ * auVar86._12_4_ * auVar37._12_4_;
            auVar159._16_4_ = auVar153._16_4_ * auVar86._16_4_ * 0.0;
            auVar159._20_4_ = auVar153._20_4_ * auVar86._20_4_ * 0.0;
            auVar159._24_4_ = auVar153._24_4_ * auVar86._24_4_ * 0.0;
            auVar159._28_4_ = 0;
            auVar140 = ZEXT3264(auVar28);
            auVar102 = ZEXT3264(auVar27);
            auVar44 = vcvtdq2ps_avx(auVar144);
            auVar37 = vfmadd231ps_fma(auVar159,auVar44,auVar181);
            auVar37 = vfmsub231ps_fma(ZEXT1632(auVar37),auVar60,auVar153);
            auVar17 = vcmpps_avx(ZEXT1632(auVar148),ZEXT832(0) << 0x20,2);
            auVar154 = ZEXT3264(auVar45);
            auVar98._8_4_ = 0x3f800000;
            auVar98._0_8_ = 0x3f8000003f800000;
            auVar98._12_4_ = 0x3f800000;
            auVar98._16_4_ = 0x3f800000;
            auVar98._20_4_ = 0x3f800000;
            auVar98._24_4_ = 0x3f800000;
            auVar98._28_4_ = 0x3f800000;
            auVar93 = ZEXT3264(auVar98);
            auVar41 = vsubps_avx(ZEXT1632(auVar37),auVar86);
            auVar160._8_4_ = 0x42b0c0a5;
            auVar160._0_8_ = 0x42b0c0a542b0c0a5;
            auVar160._12_4_ = 0x42b0c0a5;
            auVar160._16_4_ = 0x42b0c0a5;
            auVar160._20_4_ = 0x42b0c0a5;
            auVar160._24_4_ = 0x42b0c0a5;
            auVar160._28_4_ = 0x42b0c0a5;
            auVar115 = ZEXT3264(auVar160);
            auVar37 = vfmsub231ps_fma(auVar41,auVar45,auVar44);
            auVar87._0_4_ = auVar37._0_4_ * -2.0;
            auVar87._4_4_ = auVar37._4_4_ * -2.0;
            auVar87._8_4_ = auVar37._8_4_ * -2.0;
            auVar87._12_4_ = auVar37._12_4_ * -2.0;
            auVar87._16_4_ = 0x80000000;
            auVar87._20_4_ = 0x80000000;
            auVar87._24_4_ = 0x80000000;
            auVar87._28_4_ = 0;
            auVar26._8_4_ = 0x7fffffff;
            auVar26._0_8_ = 0x7fffffff7fffffff;
            auVar26._12_4_ = 0x7fffffff;
            auVar26._16_4_ = 0x7fffffff;
            auVar26._20_4_ = 0x7fffffff;
            auVar26._24_4_ = 0x7fffffff;
            auVar26._28_4_ = 0x7fffffff;
            auVar17 = vblendvps_avx(auVar87,auVar26,auVar17);
            auVar17 = vminps_avx(auVar160,auVar17);
            auVar44 = vmaxps_avx(auVar28,auVar17);
            auVar37 = vfmadd213ps_fma(auVar27,auVar44,auVar60);
            auVar41 = vroundps_avx(ZEXT1632(auVar37),1);
            auVar17 = vcmpps_avx(ZEXT1632(auVar37),auVar41,1);
            auVar17 = vandps_avx(auVar17,auVar98);
            auVar17 = vsubps_avx(auVar41,auVar17);
            auVar37 = vfmsub231ps_fma(auVar44,auVar17,auVar45);
            auVar54 = vfnmsub231ps_fma(ZEXT1632(auVar37),auVar17,auVar181);
            auVar44 = ZEXT1632(auVar54);
            auVar41._28_4_ = auVar41._28_4_;
            auVar41._0_28_ =
                 ZEXT1628(CONCAT412(auVar54._12_4_ * auVar54._12_4_,
                                    CONCAT48(auVar54._8_4_ * auVar54._8_4_,
                                             CONCAT44(auVar54._4_4_ * auVar54._4_4_,
                                                      auVar54._0_4_ * auVar54._0_4_))));
            auVar37 = vfmadd213ps_fma(auVar172,auVar44,auVar167);
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar44,auVar127);
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar44,auVar47);
            auVar27._8_4_ = 0x3e2aaaaa;
            auVar27._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar27._12_4_ = 0x3e2aaaaa;
            auVar27._16_4_ = 0x3e2aaaaa;
            auVar27._20_4_ = 0x3e2aaaaa;
            auVar27._24_4_ = 0x3e2aaaaa;
            auVar27._28_4_ = 0x3e2aaaaa;
            auVar44 = ZEXT1632(auVar54);
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar44,auVar27);
            auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar44,auVar60);
            auVar148 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar41,auVar44);
            auVar54._8_4_ = 0x3f800000;
            auVar54._0_8_ = 0x3f8000003f800000;
            auVar54._12_4_ = 0x3f800000;
            auVar35._0_4_ = (int)auVar17._0_4_;
            auVar35._4_4_ = (int)auVar17._4_4_;
            auVar35._8_4_ = (int)auVar17._8_4_;
            auVar35._12_4_ = (int)auVar17._12_4_;
            auVar45._16_4_ = (int)auVar17._16_4_;
            auVar45._0_16_ = auVar35;
            auVar45._20_4_ = (int)auVar17._20_4_;
            auVar45._24_4_ = (int)auVar17._24_4_;
            auVar45._28_4_ = (int)auVar17._28_4_;
            auVar78 = vpslld_avx(auVar35,0x17);
            auVar37 = vpslld_avx(auVar45._16_16_,0x17);
            auVar37 = vpaddd_avx(auVar37,auVar54);
            auVar54 = vpaddd_avx(auVar78,auVar54);
            auVar46._16_16_ = auVar37;
            auVar46._0_16_ = auVar54;
            auVar88._0_4_ = auVar148._0_4_ + 1.0;
            auVar88._4_4_ = auVar148._4_4_ + 1.0;
            auVar88._8_4_ = auVar148._8_4_ + 1.0;
            auVar88._12_4_ = auVar148._12_4_ + 1.0;
            auVar88._16_4_ = 0x3f800000;
            auVar88._20_4_ = 0x3f800000;
            auVar88._24_4_ = 0x3f800000;
            auVar88._28_4_ = 0x3f800000;
            auVar37 = vfmadd213ps_fma(auVar46,auVar88,auVar98);
            auVar17 = vrcpps_avx(ZEXT1632(auVar37));
            auVar37 = vfmsub213ps_fma(ZEXT1632(auVar37),auVar17,auVar98);
            auVar37 = vfnmadd132ps_fma(ZEXT1632(auVar37),auVar17,auVar17);
            auVar89._8_4_ = 0xc0000000;
            auVar89._0_8_ = 0xc0000000c0000000;
            auVar89._12_4_ = 0xc0000000;
            auVar89._16_4_ = 0xc0000000;
            auVar89._20_4_ = 0xc0000000;
            auVar89._24_4_ = 0xc0000000;
            auVar89._28_4_ = 0xc0000000;
            auVar28._8_4_ = 0xbf800000;
            auVar28._0_8_ = 0xbf800000bf800000;
            auVar28._12_4_ = 0xbf800000;
            auVar28._16_4_ = 0xbf800000;
            auVar28._20_4_ = 0xbf800000;
            auVar28._24_4_ = 0xbf800000;
            auVar28._28_4_ = 0xbf800000;
            auVar37 = vfnmadd213ps_fma(ZEXT1632(auVar37),auVar89,auVar28);
            local_58 = auVar99._0_4_;
            fStack_54 = auVar99._4_4_;
            fStack_50 = auVar99._8_4_;
            fStack_4c = auVar99._12_4_;
            fStack_48 = auVar99._16_4_;
            fStack_44 = auVar99._20_4_;
            fStack_40 = auVar99._24_4_;
            *(float *)*pauVar11 = auVar37._0_4_ * local_58;
            *(float *)(*pauVar11 + 4) = auVar37._4_4_ * fStack_54;
            *(float *)(*pauVar11 + 8) = auVar37._8_4_ * fStack_50;
            *(float *)(*pauVar11 + 0xc) = auVar37._12_4_ * fStack_4c;
            *(float *)(*pauVar11 + 0x10) = fStack_48 * 0.0;
            *(float *)(*pauVar11 + 0x14) = fStack_44 * 0.0;
            *(float *)(*pauVar11 + 0x18) = fStack_40 * 0.0;
            *(undefined4 *)(*pauVar11 + 0x1c) = 0xbf800000;
            auVar52 = ZEXT3264(CONCAT428(0x800000,CONCAT424(0x800000,CONCAT420(0x800000,CONCAT416(
                                                  0x800000,CONCAT412(0x800000,CONCAT48(0x800000,
                                                  0x80000000800000)))))));
            pauVar11 = pauVar11 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar10);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar8) {
      uVar5 = 0;
      auVar176 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
      auVar183 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
      auVar162 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
      auVar163._8_4_ = 0x3f000000;
      auVar163._0_8_ = 0x3f0000003f000000;
      auVar163._12_4_ = 0x3f000000;
      auVar154 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar115 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
      auVar116._8_4_ = 0xb95e8083;
      auVar116._0_8_ = 0xb95e8083b95e8083;
      auVar116._12_4_ = 0xb95e8083;
      auVar170._8_4_ = 0x3ab743ce;
      auVar170._0_8_ = 0x3ab743ce3ab743ce;
      auVar170._12_4_ = 0x3ab743ce;
      auVar165._8_4_ = 0x39506967;
      auVar165._0_8_ = 0x3950696739506967;
      auVar165._12_4_ = 0x39506967;
      auVar52 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
      auVar93 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
      auVar140 = ZEXT1664(CONCAT412(0x3e2aaaaa,CONCAT48(0x3e2aaaaa,0x3e2aaaaa3e2aaaaa)));
      auVar102 = ZEXT1664(CONCAT412(0x800000,CONCAT48(0x800000,0x80000000800000)));
      do {
        if (0 < (int)uVar9) {
          pauVar7 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          uVar8 = uVar9;
          do {
            auVar37 = *pauVar7;
            auVar151 = auVar176._0_16_;
            auVar54 = vminps_avx(auVar151,auVar37);
            auVar107 = auVar183._0_16_;
            auVar78 = vmaxps_avx(auVar54,auVar107);
            auVar54 = vfmadd213ps_fma(auVar162._0_16_,auVar78,auVar163);
            auVar177._0_4_ = (int)auVar54._0_4_;
            auVar177._4_4_ = (int)auVar54._4_4_;
            auVar177._8_4_ = (int)auVar54._8_4_;
            auVar177._12_4_ = (int)auVar54._12_4_;
            auVar148 = vcvtdq2ps_avx(auVar177);
            auVar54 = vcmpps_avx(auVar54,auVar148,1);
            auVar117 = auVar154._0_16_;
            auVar54 = vandps_avx(auVar117,auVar54);
            auVar54 = vsubps_avx(auVar148,auVar54);
            auVar36 = auVar115._0_16_;
            auVar148 = vfmsub231ps_fma(auVar78,auVar54,auVar36);
            auVar78 = vfnmsub231ps_fma(auVar148,auVar54,auVar116);
            auVar178._0_4_ = auVar78._0_4_ * auVar78._0_4_;
            auVar178._4_4_ = auVar78._4_4_ * auVar78._4_4_;
            auVar178._8_4_ = auVar78._8_4_ * auVar78._8_4_;
            auVar178._12_4_ = auVar78._12_4_ * auVar78._12_4_;
            auVar148 = vfmadd213ps_fma(auVar165,auVar78,auVar170);
            auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar52._0_16_);
            auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar93._0_16_);
            auVar38 = auVar140._0_16_;
            auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar38);
            auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar163);
            auVar148 = vfmadd213ps_fma(auVar148,auVar178,auVar78);
            auVar147._0_4_ = auVar148._0_4_ + auVar154._0_4_;
            auVar147._4_4_ = auVar148._4_4_ + auVar154._4_4_;
            auVar147._8_4_ = auVar148._8_4_ + auVar154._8_4_;
            auVar147._12_4_ = auVar148._12_4_ + auVar154._12_4_;
            auVar53._0_4_ = (int)auVar54._0_4_;
            auVar53._4_4_ = (int)auVar54._4_4_;
            auVar53._8_4_ = (int)auVar54._8_4_;
            auVar53._12_4_ = (int)auVar54._12_4_;
            auVar54 = vpslld_avx(auVar53,0x17);
            auVar54 = vpaddd_avx(auVar54,auVar117);
            auVar150 = vfmadd213ps_fma(auVar54,auVar147,auVar117);
            auVar54 = vmaxps_avx(auVar150,auVar102._0_16_);
            auVar148 = vpsrld_avx(auVar54,0x17);
            auVar29._8_4_ = 0xffffff82;
            auVar29._0_8_ = 0xffffff82ffffff82;
            auVar29._12_4_ = 0xffffff82;
            auVar148 = vpaddd_avx(auVar148,auVar29);
            auVar30._8_4_ = 0x807fffff;
            auVar30._0_8_ = 0x807fffff807fffff;
            auVar30._12_4_ = 0x807fffff;
            auVar54 = vandps_avx(auVar54,auVar30);
            auVar35 = vorps_avx(auVar163,auVar54);
            auVar78 = vcvtdq2ps_avx(auVar148);
            auVar31._8_4_ = 0x3f3504f3;
            auVar31._0_8_ = 0x3f3504f33f3504f3;
            auVar31._12_4_ = 0x3f3504f3;
            auVar148 = vcmpps_avx(auVar35,auVar31,1);
            auVar54 = vandps_avx(auVar148,auVar35);
            auVar32._0_4_ = auVar35._0_4_ + -1.0 + auVar54._0_4_;
            auVar32._4_4_ = auVar35._4_4_ + -1.0 + auVar54._4_4_;
            auVar32._8_4_ = auVar35._8_4_ + -1.0 + auVar54._8_4_;
            auVar32._12_4_ = auVar35._12_4_ + -1.0 + auVar54._12_4_;
            auVar54 = vandps_avx(auVar148,auVar117);
            auVar148 = vsubps_avx(auVar78,auVar54);
            auVar149._0_4_ = auVar32._0_4_ * auVar32._0_4_;
            auVar149._4_4_ = auVar32._4_4_ * auVar32._4_4_;
            auVar149._8_4_ = auVar32._8_4_ * auVar32._8_4_;
            auVar149._12_4_ = auVar32._12_4_ * auVar32._12_4_;
            auVar179._8_4_ = 0x3d9021bb;
            auVar179._0_8_ = 0x3d9021bb3d9021bb;
            auVar179._12_4_ = 0x3d9021bb;
            auVar67._8_4_ = 0xbdebd1b8;
            auVar67._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar67._12_4_ = 0xbdebd1b8;
            auVar54 = vfmadd213ps_fma(auVar179,auVar32,auVar67);
            auVar68._8_4_ = 0x3def251a;
            auVar68._0_8_ = 0x3def251a3def251a;
            auVar68._12_4_ = 0x3def251a;
            auVar54 = vfmadd213ps_fma(auVar54,auVar32,auVar68);
            auVar69._8_4_ = 0xbdfe5d4f;
            auVar69._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar69._12_4_ = 0xbdfe5d4f;
            auVar54 = vfmadd213ps_fma(auVar54,auVar32,auVar69);
            auVar70._8_4_ = 0x3e11e9bf;
            auVar70._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar70._12_4_ = 0x3e11e9bf;
            auVar54 = vfmadd213ps_fma(auVar54,auVar32,auVar70);
            auVar71._8_4_ = 0xbe2aae50;
            auVar71._0_8_ = 0xbe2aae50be2aae50;
            auVar71._12_4_ = 0xbe2aae50;
            auVar54 = vfmadd213ps_fma(auVar54,auVar32,auVar71);
            auVar72._8_4_ = 0x3e4cceac;
            auVar72._0_8_ = 0x3e4cceac3e4cceac;
            auVar72._12_4_ = 0x3e4cceac;
            auVar54 = vfmadd213ps_fma(auVar54,auVar32,auVar72);
            auVar73._8_4_ = 0xbe7ffffc;
            auVar73._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar73._12_4_ = 0xbe7ffffc;
            auVar54 = vfmadd213ps_fma(auVar54,auVar32,auVar73);
            auVar74._8_4_ = 0x3eaaaaaa;
            auVar74._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar74._12_4_ = 0x3eaaaaaa;
            auVar54 = vfmadd213ps_fma(auVar54,auVar32,auVar74);
            auVar103._0_4_ = auVar54._0_4_ * auVar149._0_4_ * auVar32._0_4_;
            auVar103._4_4_ = auVar54._4_4_ * auVar149._4_4_ * auVar32._4_4_;
            auVar103._8_4_ = auVar54._8_4_ * auVar149._8_4_ * auVar32._8_4_;
            auVar103._12_4_ = auVar54._12_4_ * auVar149._12_4_ * auVar32._12_4_;
            auVar183 = ZEXT1664(auVar107);
            auVar155._8_4_ = 0x3fb8aa3b;
            auVar155._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar155._12_4_ = 0x3fb8aa3b;
            auVar162 = ZEXT1664(auVar155);
            auVar54 = vfmadd231ps_fma(auVar103,auVar148,auVar116);
            auVar78 = vfmsub231ps_fma(auVar54,auVar163,auVar149);
            auVar54 = vcmpps_avx(auVar150,ZEXT816(0),2);
            auVar176 = ZEXT1664(auVar151);
            auVar141._8_4_ = 0x40000000;
            auVar141._0_8_ = 0x4000000040000000;
            auVar141._12_4_ = 0x40000000;
            auVar75._8_4_ = 0x7fffffff;
            auVar75._0_8_ = 0x7fffffff7fffffff;
            auVar75._12_4_ = 0x7fffffff;
            auVar78 = vsubps_avx(auVar78,auVar32);
            auVar148 = vfnmadd231ps_fma(auVar78,auVar36,auVar148);
            auVar33._0_4_ = auVar148._0_4_ + auVar148._0_4_;
            auVar33._4_4_ = auVar148._4_4_ + auVar148._4_4_;
            auVar33._8_4_ = auVar148._8_4_ + auVar148._8_4_;
            auVar33._12_4_ = auVar148._12_4_ + auVar148._12_4_;
            auVar54 = vblendvps_avx(auVar33,auVar75,auVar54);
            auVar54 = vminps_avx(auVar151,auVar54);
            auVar78 = vmaxps_avx(auVar107,auVar54);
            auVar54 = vfmadd213ps_fma(auVar155,auVar78,auVar163);
            auVar104._0_4_ = (int)auVar54._0_4_;
            auVar104._4_4_ = (int)auVar54._4_4_;
            auVar104._8_4_ = (int)auVar54._8_4_;
            auVar104._12_4_ = (int)auVar54._12_4_;
            auVar148 = vcvtdq2ps_avx(auVar104);
            auVar54 = vcmpps_avx(auVar54,auVar148,1);
            auVar54 = vandps_avx(auVar54,auVar117);
            auVar54 = vsubps_avx(auVar148,auVar54);
            auVar148 = vfmsub231ps_fma(auVar78,auVar54,auVar36);
            auVar78 = vfnmsub231ps_fma(auVar148,auVar54,auVar116);
            auVar105._0_4_ = auVar78._0_4_ * auVar78._0_4_;
            auVar105._4_4_ = auVar78._4_4_ * auVar78._4_4_;
            auVar105._8_4_ = auVar78._8_4_ * auVar78._8_4_;
            auVar105._12_4_ = auVar78._12_4_ * auVar78._12_4_;
            auVar148 = vfmadd213ps_fma(auVar165,auVar78,auVar170);
            auVar76._8_4_ = 0x3c088908;
            auVar76._0_8_ = 0x3c0889083c088908;
            auVar76._12_4_ = 0x3c088908;
            auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar76);
            auVar77._8_4_ = 0x3d2aa9c1;
            auVar77._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar77._12_4_ = 0x3d2aa9c1;
            auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar77);
            auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar38);
            auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar163);
            auVar148 = vfmadd213ps_fma(auVar148,auVar105,auVar78);
            auVar34._0_4_ = auVar148._0_4_ + auVar154._0_4_;
            auVar34._4_4_ = auVar148._4_4_ + auVar154._4_4_;
            auVar34._8_4_ = auVar148._8_4_ + auVar154._8_4_;
            auVar34._12_4_ = auVar148._12_4_ + auVar154._12_4_;
            auVar154 = ZEXT1664(auVar117);
            auVar55._0_4_ = (int)auVar54._0_4_;
            auVar55._4_4_ = (int)auVar54._4_4_;
            auVar55._8_4_ = (int)auVar54._8_4_;
            auVar55._12_4_ = (int)auVar54._12_4_;
            auVar54 = vpslld_avx(auVar55,0x17);
            auVar54 = vpaddd_avx(auVar54,auVar117);
            auVar148 = vfmadd213ps_fma(auVar54,auVar34,auVar117);
            auVar54 = vrcpps_avx(auVar148);
            auVar106._0_4_ = auVar54._0_4_ + auVar54._0_4_;
            auVar106._4_4_ = auVar54._4_4_ + auVar54._4_4_;
            auVar106._8_4_ = auVar54._8_4_ + auVar54._8_4_;
            auVar106._12_4_ = auVar54._12_4_ + auVar54._12_4_;
            auVar148 = vfmsub213ps_fma(auVar148,auVar106,auVar141);
            auVar54 = vfnmadd213ps_fma(auVar148,auVar54,auVar106);
            auVar115 = ZEXT1664(auVar36);
            auVar140 = ZEXT1664(auVar38);
            auVar102 = ZEXT1664(CONCAT412(0x800000,CONCAT48(0x800000,0x80000000800000)));
            auVar52 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
            auVar93 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
            auVar37 = vfmsub213ps_fma(auVar54,auVar37,auVar37);
            *pauVar7 = auVar37;
            pauVar7 = pauVar7 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar10);
    }
  }
  else if (0 < (int)uVar8) {
    uVar5 = 0;
    do {
      auVar138._8_4_ = 0x3f000000;
      auVar138._0_8_ = 0x3f0000003f000000;
      auVar128._8_4_ = 0x3d2aa9c1;
      auVar128._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar110._8_4_ = 0x3c088908;
      auVar110._0_8_ = 0x3c0889083c088908;
      auVar99._8_4_ = 0x3f800000;
      auVar99._0_8_ = 0x3f8000003f800000;
      auVar138._12_4_ = 0x3f000000;
      auVar128._12_4_ = 0x3d2aa9c1;
      auVar110._12_4_ = 0x3c088908;
      auVar99._12_4_ = 0x3f800000;
      auVar138._16_4_ = 0x3f000000;
      auVar128._16_4_ = 0x3d2aa9c1;
      auVar110._16_4_ = 0x3c088908;
      auVar99._16_4_ = 0x3f800000;
      auVar138._20_4_ = 0x3f000000;
      auVar128._20_4_ = 0x3d2aa9c1;
      auVar110._20_4_ = 0x3c088908;
      auVar99._20_4_ = 0x3f800000;
      auVar138._24_4_ = 0x3f000000;
      auVar128._24_4_ = 0x3d2aa9c1;
      auVar110._24_4_ = 0x3c088908;
      auVar99._24_4_ = 0x3f800000;
      auVar138._28_4_ = 0x3f000000;
      auVar128._28_4_ = 0x3d2aa9c1;
      auVar110._28_4_ = 0x3c088908;
      auVar99._28_4_ = 0x3f800000;
      pauVar11 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar9 < 8) {
        uVar8 = 0;
      }
      else {
        iVar4 = 7;
        do {
          auVar60 = *pauVar11;
          auVar173._8_4_ = 0x42b0c0a5;
          auVar173._0_8_ = 0x42b0c0a542b0c0a5;
          auVar173._12_4_ = 0x42b0c0a5;
          auVar173._16_4_ = 0x42b0c0a5;
          auVar173._20_4_ = 0x42b0c0a5;
          auVar173._24_4_ = 0x42b0c0a5;
          auVar173._28_4_ = 0x42b0c0a5;
          auVar127 = vminps_avx(auVar173,auVar60);
          auVar168._8_4_ = 0xc2b0c0a5;
          auVar168._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar168._12_4_ = 0xc2b0c0a5;
          auVar168._16_4_ = 0xc2b0c0a5;
          auVar168._20_4_ = 0xc2b0c0a5;
          auVar168._24_4_ = 0xc2b0c0a5;
          auVar168._28_4_ = 0xc2b0c0a5;
          auVar47 = vmaxps_avx(auVar168,auVar127);
          auVar169._8_4_ = 0x3fb8aa3b;
          auVar169._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar169._12_4_ = 0x3fb8aa3b;
          auVar169._16_4_ = 0x3fb8aa3b;
          auVar169._20_4_ = 0x3fb8aa3b;
          auVar169._24_4_ = 0x3fb8aa3b;
          auVar169._28_4_ = 0x3fb8aa3b;
          auVar37 = vfmadd213ps_fma(auVar169,auVar47,auVar138);
          auVar167 = vroundps_avx(ZEXT1632(auVar37),1);
          auVar127 = vcmpps_avx(ZEXT1632(auVar37),auVar167,1);
          auVar127 = vandps_avx(auVar127,auVar99);
          auVar127 = vsubps_avx(auVar167,auVar127);
          auVar161._8_4_ = 0x3f318000;
          auVar161._0_8_ = 0x3f3180003f318000;
          auVar161._12_4_ = 0x3f318000;
          auVar161._16_4_ = 0x3f318000;
          auVar161._20_4_ = 0x3f318000;
          auVar161._24_4_ = 0x3f318000;
          auVar161._28_4_ = 0x3f318000;
          auVar37 = vfmsub231ps_fma(auVar47,auVar127,auVar161);
          auVar139._8_4_ = 0xb95e8083;
          auVar139._0_8_ = 0xb95e8083b95e8083;
          auVar139._12_4_ = 0xb95e8083;
          auVar139._16_4_ = 0xb95e8083;
          auVar139._20_4_ = 0xb95e8083;
          auVar139._24_4_ = 0xb95e8083;
          auVar139._28_4_ = 0xb95e8083;
          auVar54 = vfnmsub231ps_fma(ZEXT1632(auVar37),auVar127,auVar139);
          auVar47 = ZEXT1632(auVar54);
          auVar1._28_4_ = auVar167._28_4_;
          auVar1._0_28_ =
               ZEXT1628(CONCAT412(auVar54._12_4_ * auVar54._12_4_,
                                  CONCAT48(auVar54._8_4_ * auVar54._8_4_,
                                           CONCAT44(auVar54._4_4_ * auVar54._4_4_,
                                                    auVar54._0_4_ * auVar54._0_4_))));
          auVar145._8_4_ = 0x39506967;
          auVar145._0_8_ = 0x3950696739506967;
          auVar145._12_4_ = 0x39506967;
          auVar145._16_4_ = 0x39506967;
          auVar145._20_4_ = 0x39506967;
          auVar145._24_4_ = 0x39506967;
          auVar145._28_4_ = 0x39506967;
          auVar175._8_4_ = 0x3ab743ce;
          auVar175._0_8_ = 0x3ab743ce3ab743ce;
          auVar175._12_4_ = 0x3ab743ce;
          auVar175._16_4_ = 0x3ab743ce;
          auVar175._20_4_ = 0x3ab743ce;
          auVar175._24_4_ = 0x3ab743ce;
          auVar175._28_4_ = 0x3ab743ce;
          auVar37 = vfmadd213ps_fma(auVar145,auVar47,auVar175);
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar47,auVar110);
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar47,auVar128);
          auVar182._8_4_ = 0x3e2aaaaa;
          auVar182._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar182._12_4_ = 0x3e2aaaaa;
          auVar182._16_4_ = 0x3e2aaaaa;
          auVar182._20_4_ = 0x3e2aaaaa;
          auVar182._24_4_ = 0x3e2aaaaa;
          auVar182._28_4_ = 0x3e2aaaaa;
          auVar47 = ZEXT1632(auVar54);
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar47,auVar182);
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar47,auVar138);
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar1,auVar47);
          auVar90._0_4_ = auVar37._0_4_ + 1.0;
          auVar90._4_4_ = auVar37._4_4_ + 1.0;
          auVar90._8_4_ = auVar37._8_4_ + 1.0;
          auVar90._12_4_ = auVar37._12_4_ + 1.0;
          auVar90._16_4_ = 0x3f800000;
          auVar90._20_4_ = 0x3f800000;
          auVar90._24_4_ = 0x3f800000;
          auVar90._28_4_ = 0x3f800000;
          auVar36._0_4_ = (int)auVar127._0_4_;
          auVar36._4_4_ = (int)auVar127._4_4_;
          auVar36._8_4_ = (int)auVar127._8_4_;
          auVar36._12_4_ = (int)auVar127._12_4_;
          auVar48._16_4_ = (int)auVar127._16_4_;
          auVar48._0_16_ = auVar36;
          auVar48._20_4_ = (int)auVar127._20_4_;
          auVar48._24_4_ = (int)auVar127._24_4_;
          auVar48._28_4_ = (int)auVar127._28_4_;
          auVar54 = vpslld_avx(auVar36,0x17);
          auVar37 = vpslld_avx(auVar48._16_16_,0x17);
          auVar151._8_4_ = 0x3f800000;
          auVar151._0_8_ = 0x3f8000003f800000;
          auVar151._12_4_ = 0x3f800000;
          auVar37 = vpaddd_avx(auVar151,auVar37);
          auVar54 = vpaddd_avx(auVar151,auVar54);
          auVar49._16_16_ = auVar37;
          auVar49._0_16_ = auVar54;
          auVar148 = vfmadd213ps_fma(auVar49,auVar90,auVar99);
          auVar61._8_4_ = 0x800000;
          auVar61._0_8_ = 0x80000000800000;
          auVar61._12_4_ = 0x800000;
          auVar61._16_4_ = 0x800000;
          auVar61._20_4_ = 0x800000;
          auVar61._24_4_ = 0x800000;
          auVar61._28_4_ = 0x800000;
          auVar127 = vmaxps_avx(ZEXT1632(auVar148),auVar61);
          auVar54 = vpsrld_avx(auVar127._0_16_,0x17);
          auVar37 = vpsrld_avx(auVar127._16_16_,0x17);
          auVar111._8_4_ = 0x807fffff;
          auVar111._0_8_ = 0x807fffff807fffff;
          auVar111._12_4_ = 0x807fffff;
          auVar111._16_4_ = 0x807fffff;
          auVar111._20_4_ = 0x807fffff;
          auVar111._24_4_ = 0x807fffff;
          auVar111._28_4_ = 0x807fffff;
          auVar127 = vandps_avx(auVar127,auVar111);
          auVar167 = vorps_avx(auVar138,auVar127);
          auVar112._8_4_ = 0x3f3504f3;
          auVar112._0_8_ = 0x3f3504f33f3504f3;
          auVar112._12_4_ = 0x3f3504f3;
          auVar112._16_4_ = 0x3f3504f3;
          auVar112._20_4_ = 0x3f3504f3;
          auVar112._24_4_ = 0x3f3504f3;
          auVar112._28_4_ = 0x3f3504f3;
          auVar47 = vcmpps_avx(auVar112,auVar167,2);
          auVar127 = vandnps_avx(auVar47,auVar167);
          auVar146._8_4_ = 0xc0000000;
          auVar146._0_8_ = 0xc0000000c0000000;
          auVar146._12_4_ = 0xc0000000;
          auVar146._16_4_ = 0xc0000000;
          auVar146._20_4_ = 0xc0000000;
          auVar146._24_4_ = 0xc0000000;
          auVar146._28_4_ = 0xc0000000;
          auVar62._0_4_ = auVar167._0_4_ + -1.0 + auVar127._0_4_;
          auVar62._4_4_ = auVar167._4_4_ + -1.0 + auVar127._4_4_;
          auVar62._8_4_ = auVar167._8_4_ + -1.0 + auVar127._8_4_;
          auVar62._12_4_ = auVar167._12_4_ + -1.0 + auVar127._12_4_;
          auVar62._16_4_ = auVar167._16_4_ + -1.0 + auVar127._16_4_;
          auVar62._20_4_ = auVar167._20_4_ + -1.0 + auVar127._20_4_;
          auVar62._24_4_ = auVar167._24_4_ + -1.0 + auVar127._24_4_;
          auVar62._28_4_ = auVar167._28_4_ + -1.0 + auVar127._28_4_;
          auVar37 = vpsubd_avx(auVar37,auVar47._16_16_);
          auVar117._8_4_ = 0xffffff81;
          auVar117._0_8_ = 0xffffff81ffffff81;
          auVar117._12_4_ = 0xffffff81;
          auVar37 = vpaddd_avx(auVar37,auVar117);
          auVar54 = vpsubd_avx(auVar54,auVar47._0_16_);
          auVar54 = vpaddd_avx(auVar54,auVar117);
          auVar91._16_16_ = auVar37;
          auVar91._0_16_ = auVar54;
          auVar100._0_4_ = auVar62._0_4_ * auVar62._0_4_;
          auVar100._4_4_ = auVar62._4_4_ * auVar62._4_4_;
          auVar100._8_4_ = auVar62._8_4_ * auVar62._8_4_;
          auVar100._12_4_ = auVar62._12_4_ * auVar62._12_4_;
          auVar100._16_4_ = auVar62._16_4_ * auVar62._16_4_;
          auVar100._20_4_ = auVar62._20_4_ * auVar62._20_4_;
          auVar100._24_4_ = auVar62._24_4_ * auVar62._24_4_;
          auVar100._28_4_ = 0;
          auVar113._8_4_ = 0x3d9021bb;
          auVar113._0_8_ = 0x3d9021bb3d9021bb;
          auVar113._12_4_ = 0x3d9021bb;
          auVar113._16_4_ = 0x3d9021bb;
          auVar113._20_4_ = 0x3d9021bb;
          auVar113._24_4_ = 0x3d9021bb;
          auVar113._28_4_ = 0x3d9021bb;
          auVar129._8_4_ = 0xbdebd1b8;
          auVar129._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar129._12_4_ = 0xbdebd1b8;
          auVar129._16_4_ = 0xbdebd1b8;
          auVar129._20_4_ = 0xbdebd1b8;
          auVar129._24_4_ = 0xbdebd1b8;
          auVar129._28_4_ = 0xbdebd1b8;
          auVar37 = vfmadd213ps_fma(auVar113,auVar62,auVar129);
          auVar130._8_4_ = 0x3def251a;
          auVar130._0_8_ = 0x3def251a3def251a;
          auVar130._12_4_ = 0x3def251a;
          auVar130._16_4_ = 0x3def251a;
          auVar130._20_4_ = 0x3def251a;
          auVar130._24_4_ = 0x3def251a;
          auVar130._28_4_ = 0x3def251a;
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar62,auVar130);
          auVar131._8_4_ = 0xbdfe5d4f;
          auVar131._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar131._12_4_ = 0xbdfe5d4f;
          auVar131._16_4_ = 0xbdfe5d4f;
          auVar131._20_4_ = 0xbdfe5d4f;
          auVar131._24_4_ = 0xbdfe5d4f;
          auVar131._28_4_ = 0xbdfe5d4f;
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar62,auVar131);
          auVar132._8_4_ = 0x3e11e9bf;
          auVar132._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar132._12_4_ = 0x3e11e9bf;
          auVar132._16_4_ = 0x3e11e9bf;
          auVar132._20_4_ = 0x3e11e9bf;
          auVar132._24_4_ = 0x3e11e9bf;
          auVar132._28_4_ = 0x3e11e9bf;
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar62,auVar132);
          auVar133._8_4_ = 0xbe2aae50;
          auVar133._0_8_ = 0xbe2aae50be2aae50;
          auVar133._12_4_ = 0xbe2aae50;
          auVar133._16_4_ = 0xbe2aae50;
          auVar133._20_4_ = 0xbe2aae50;
          auVar133._24_4_ = 0xbe2aae50;
          auVar133._28_4_ = 0xbe2aae50;
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar62,auVar133);
          auVar134._8_4_ = 0x3e4cceac;
          auVar134._0_8_ = 0x3e4cceac3e4cceac;
          auVar134._12_4_ = 0x3e4cceac;
          auVar134._16_4_ = 0x3e4cceac;
          auVar134._20_4_ = 0x3e4cceac;
          auVar134._24_4_ = 0x3e4cceac;
          auVar134._28_4_ = 0x3e4cceac;
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar62,auVar134);
          auVar135._8_4_ = 0xbe7ffffc;
          auVar135._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar135._12_4_ = 0xbe7ffffc;
          auVar135._16_4_ = 0xbe7ffffc;
          auVar135._20_4_ = 0xbe7ffffc;
          auVar135._24_4_ = 0xbe7ffffc;
          auVar135._28_4_ = 0xbe7ffffc;
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar62,auVar135);
          auVar136._8_4_ = 0x3eaaaaaa;
          auVar136._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar136._12_4_ = 0x3eaaaaaa;
          auVar136._16_4_ = 0x3eaaaaaa;
          auVar136._20_4_ = 0x3eaaaaaa;
          auVar136._24_4_ = 0x3eaaaaaa;
          auVar136._28_4_ = 0x3eaaaaaa;
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar62,auVar136);
          auVar114._0_4_ = auVar100._0_4_ * auVar62._0_4_ * auVar37._0_4_;
          auVar114._4_4_ = auVar100._4_4_ * auVar62._4_4_ * auVar37._4_4_;
          auVar114._8_4_ = auVar100._8_4_ * auVar62._8_4_ * auVar37._8_4_;
          auVar114._12_4_ = auVar100._12_4_ * auVar62._12_4_ * auVar37._12_4_;
          auVar114._16_4_ = auVar100._16_4_ * auVar62._16_4_ * 0.0;
          auVar114._20_4_ = auVar100._20_4_ * auVar62._20_4_ * 0.0;
          auVar114._24_4_ = auVar100._24_4_ * auVar62._24_4_ * 0.0;
          auVar114._28_4_ = 0;
          auVar128._8_4_ = 0x3d2aa9c1;
          auVar128._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar128._12_4_ = 0x3d2aa9c1;
          auVar128._16_4_ = 0x3d2aa9c1;
          auVar128._20_4_ = 0x3d2aa9c1;
          auVar128._24_4_ = 0x3d2aa9c1;
          auVar128._28_4_ = 0x3d2aa9c1;
          auVar47 = vcvtdq2ps_avx(auVar91);
          auVar37 = vfmadd231ps_fma(auVar114,auVar47,auVar139);
          auVar37 = vfmsub231ps_fma(ZEXT1632(auVar37),auVar138,auVar100);
          auVar127 = vcmpps_avx(ZEXT1632(auVar148),_DAT_0059ad40,2);
          auVar167 = vsubps_avx(ZEXT1632(auVar37),auVar62);
          auVar110._8_4_ = 0x3c088908;
          auVar110._0_8_ = 0x3c0889083c088908;
          auVar110._12_4_ = 0x3c088908;
          auVar110._16_4_ = 0x3c088908;
          auVar110._20_4_ = 0x3c088908;
          auVar110._24_4_ = 0x3c088908;
          auVar110._28_4_ = 0x3c088908;
          auVar37 = vfmsub231ps_fma(auVar167,auVar161,auVar47);
          auVar63._0_4_ = auVar37._0_4_ * -2.0;
          auVar63._4_4_ = auVar37._4_4_ * -2.0;
          auVar63._8_4_ = auVar37._8_4_ * -2.0;
          auVar63._12_4_ = auVar37._12_4_ * -2.0;
          auVar63._16_4_ = 0x80000000;
          auVar63._20_4_ = 0x80000000;
          auVar63._24_4_ = 0x80000000;
          auVar63._28_4_ = 0;
          auVar92._8_4_ = 0x7fffffff;
          auVar92._0_8_ = 0x7fffffff7fffffff;
          auVar92._12_4_ = 0x7fffffff;
          auVar92._16_4_ = 0x7fffffff;
          auVar92._20_4_ = 0x7fffffff;
          auVar92._24_4_ = 0x7fffffff;
          auVar92._28_4_ = 0x7fffffff;
          auVar127 = vblendvps_avx(auVar63,auVar92,auVar127);
          auVar127 = vminps_avx(auVar173,auVar127);
          auVar64._8_4_ = 0xc2b0c0a5;
          auVar64._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar64._12_4_ = 0xc2b0c0a5;
          auVar64._16_4_ = 0xc2b0c0a5;
          auVar64._20_4_ = 0xc2b0c0a5;
          auVar64._24_4_ = 0xc2b0c0a5;
          auVar64._28_4_ = 0xc2b0c0a5;
          auVar47 = vmaxps_avx(auVar127,auVar64);
          auVar37 = vfmadd213ps_fma(auVar169,auVar47,auVar138);
          auVar167 = vroundps_avx(ZEXT1632(auVar37),1);
          auVar127 = vcmpps_avx(ZEXT1632(auVar37),auVar167,1);
          auVar127 = vandps_avx(auVar127,auVar99);
          auVar127 = vsubps_avx(auVar167,auVar127);
          auVar37 = vfmsub231ps_fma(auVar47,auVar127,auVar161);
          auVar54 = vfnmsub231ps_fma(ZEXT1632(auVar37),auVar127,auVar139);
          auVar47 = ZEXT1632(auVar54);
          auVar2._28_4_ = auVar167._28_4_;
          auVar2._0_28_ =
               ZEXT1628(CONCAT412(auVar54._12_4_ * auVar54._12_4_,
                                  CONCAT48(auVar54._8_4_ * auVar54._8_4_,
                                           CONCAT44(auVar54._4_4_ * auVar54._4_4_,
                                                    auVar54._0_4_ * auVar54._0_4_))));
          auVar101._8_4_ = 0x39506967;
          auVar101._0_8_ = 0x3950696739506967;
          auVar101._12_4_ = 0x39506967;
          auVar101._16_4_ = 0x39506967;
          auVar101._20_4_ = 0x39506967;
          auVar101._24_4_ = 0x39506967;
          auVar101._28_4_ = 0x39506967;
          auVar37 = vfmadd213ps_fma(auVar101,auVar47,auVar175);
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar47,auVar110);
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar47,auVar128);
          auVar47 = ZEXT1632(auVar54);
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar47,auVar182);
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar47,auVar138);
          auVar148 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar2,auVar47);
          auVar38._0_4_ = (int)auVar127._0_4_;
          auVar38._4_4_ = (int)auVar127._4_4_;
          auVar38._8_4_ = (int)auVar127._8_4_;
          auVar38._12_4_ = (int)auVar127._12_4_;
          auVar50._16_4_ = (int)auVar127._16_4_;
          auVar50._0_16_ = auVar38;
          auVar50._20_4_ = (int)auVar127._20_4_;
          auVar50._24_4_ = (int)auVar127._24_4_;
          auVar50._28_4_ = (int)auVar127._28_4_;
          auVar54 = vpslld_avx(auVar38,0x17);
          auVar37 = vpslld_avx(auVar50._16_16_,0x17);
          auVar37 = vpaddd_avx(auVar151,auVar37);
          auVar54 = vpaddd_avx(auVar151,auVar54);
          auVar51._16_16_ = auVar37;
          auVar51._0_16_ = auVar54;
          auVar65._0_4_ = auVar148._0_4_ + 1.0;
          auVar65._4_4_ = auVar148._4_4_ + 1.0;
          auVar65._8_4_ = auVar148._8_4_ + 1.0;
          auVar65._12_4_ = auVar148._12_4_ + 1.0;
          auVar65._16_4_ = 0x3f800000;
          auVar65._20_4_ = 0x3f800000;
          auVar65._24_4_ = 0x3f800000;
          auVar65._28_4_ = 0x3f800000;
          auVar37 = vfmadd213ps_fma(auVar51,auVar65,auVar99);
          auVar127 = vrcpps_avx(ZEXT1632(auVar37));
          auVar37 = vfmsub213ps_fma(ZEXT1632(auVar37),auVar127,auVar99);
          auVar37 = vfnmadd132ps_fma(ZEXT1632(auVar37),auVar127,auVar127);
          auVar66._8_4_ = 0xbf800000;
          auVar66._0_8_ = 0xbf800000bf800000;
          auVar66._12_4_ = 0xbf800000;
          auVar66._16_4_ = 0xbf800000;
          auVar66._20_4_ = 0xbf800000;
          auVar66._24_4_ = 0xbf800000;
          auVar66._28_4_ = 0xbf800000;
          auVar37 = vfnmadd213ps_fma(ZEXT1632(auVar37),auVar146,auVar66);
          local_58 = auVar60._0_4_;
          fStack_54 = auVar60._4_4_;
          fStack_50 = auVar60._8_4_;
          fStack_4c = auVar60._12_4_;
          fStack_48 = auVar60._16_4_;
          fStack_44 = auVar60._20_4_;
          fStack_40 = auVar60._24_4_;
          auVar3._4_4_ = auVar37._4_4_ * fStack_54;
          auVar3._0_4_ = auVar37._0_4_ * local_58;
          auVar3._8_4_ = auVar37._8_4_ * fStack_50;
          auVar3._12_4_ = auVar37._12_4_ * fStack_4c;
          auVar3._16_4_ = fStack_48 * 0.0;
          auVar3._20_4_ = fStack_44 * 0.0;
          auVar3._24_4_ = fStack_40 * 0.0;
          auVar3._28_4_ = 0x3f800000;
          *pauVar11 = auVar3;
          pauVar11 = pauVar11 + 1;
          iVar4 = iVar4 + 8;
          uVar8 = uVar9 & 0xfffffff8;
        } while (iVar4 < (int)uVar9);
      }
      auVar137._8_4_ = 0x3f800000;
      auVar137._0_8_ = 0x3f8000003f800000;
      auVar137._12_4_ = 0x3f800000;
      auVar107._8_4_ = 0x39506967;
      auVar107._0_8_ = 0x3950696739506967;
      auVar107._12_4_ = 0x39506967;
      auVar118._8_4_ = 0x3c088908;
      auVar118._0_8_ = 0x3c0889083c088908;
      auVar118._12_4_ = 0x3c088908;
      uVar6 = uVar8 | 3;
      while ((int)uVar6 < (int)uVar9) {
        auVar37 = *(undefined1 (*) [16])*pauVar11;
        auVar152._8_4_ = 0x42b0c0a5;
        auVar152._0_8_ = 0x42b0c0a542b0c0a5;
        auVar152._12_4_ = 0x42b0c0a5;
        auVar54 = vminps_avx(auVar152,auVar37);
        auVar156._8_4_ = 0xc2b0c0a5;
        auVar156._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar156._12_4_ = 0xc2b0c0a5;
        auVar78 = vmaxps_avx(auVar156,auVar54);
        auVar180._8_4_ = 0x3fb8aa3b;
        auVar180._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar180._12_4_ = 0x3fb8aa3b;
        auVar14._8_4_ = 0x3f000000;
        auVar14._0_8_ = 0x3f0000003f000000;
        auVar14._12_4_ = 0x3f000000;
        auVar54 = vfmadd213ps_fma(auVar180,auVar78,auVar14);
        auVar79._0_4_ = (int)auVar54._0_4_;
        auVar79._4_4_ = (int)auVar54._4_4_;
        auVar79._8_4_ = (int)auVar54._8_4_;
        auVar79._12_4_ = (int)auVar54._12_4_;
        auVar148 = vcvtdq2ps_avx(auVar79);
        auVar54 = vcmpps_avx(auVar54,auVar148,1);
        auVar54 = vandps_avx(auVar54,auVar137);
        auVar54 = vsubps_avx(auVar148,auVar54);
        auVar174._8_4_ = 0x3f318000;
        auVar174._0_8_ = 0x3f3180003f318000;
        auVar174._12_4_ = 0x3f318000;
        auVar148 = vfmsub231ps_fma(auVar78,auVar54,auVar174);
        auVar164._8_4_ = 0xb95e8083;
        auVar164._0_8_ = 0xb95e8083b95e8083;
        auVar164._12_4_ = 0xb95e8083;
        auVar78 = vfnmsub231ps_fma(auVar148,auVar54,auVar164);
        auVar80._0_4_ = auVar78._0_4_ * auVar78._0_4_;
        auVar80._4_4_ = auVar78._4_4_ * auVar78._4_4_;
        auVar80._8_4_ = auVar78._8_4_ * auVar78._8_4_;
        auVar80._12_4_ = auVar78._12_4_ * auVar78._12_4_;
        auVar142._8_4_ = 0x3ab743ce;
        auVar142._0_8_ = 0x3ab743ce3ab743ce;
        auVar142._12_4_ = 0x3ab743ce;
        auVar148 = vfmadd213ps_fma(auVar107,auVar78,auVar142);
        auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar118);
        auVar171._8_4_ = 0x3d2aa9c1;
        auVar171._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar171._12_4_ = 0x3d2aa9c1;
        auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar171);
        auVar166._8_4_ = 0x3e2aaaaa;
        auVar166._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar166._12_4_ = 0x3e2aaaaa;
        auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar166);
        auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar14);
        auVar148 = vfmadd213ps_fma(auVar148,auVar80,auVar78);
        auVar81._0_4_ = auVar148._0_4_ + 1.0;
        auVar81._4_4_ = auVar148._4_4_ + 1.0;
        auVar81._8_4_ = auVar148._8_4_ + 1.0;
        auVar81._12_4_ = auVar148._12_4_ + 1.0;
        auVar39._0_4_ = (int)auVar54._0_4_;
        auVar39._4_4_ = (int)auVar54._4_4_;
        auVar39._8_4_ = (int)auVar54._8_4_;
        auVar39._12_4_ = (int)auVar54._12_4_;
        auVar54 = vpslld_avx(auVar39,0x17);
        auVar54 = vpaddd_avx(auVar54,auVar137);
        auVar150 = vfmadd213ps_fma(auVar54,auVar81,auVar137);
        auVar56._8_4_ = 0x800000;
        auVar56._0_8_ = 0x80000000800000;
        auVar56._12_4_ = 0x800000;
        auVar54 = vmaxps_avx(auVar150,auVar56);
        auVar148 = vpsrld_avx(auVar54,0x17);
        auVar94._8_4_ = 0xffffff82;
        auVar94._0_8_ = 0xffffff82ffffff82;
        auVar94._12_4_ = 0xffffff82;
        auVar148 = vpaddd_avx(auVar148,auVar94);
        auVar95._8_4_ = 0x807fffff;
        auVar95._0_8_ = 0x807fffff807fffff;
        auVar95._12_4_ = 0x807fffff;
        auVar54 = vandps_avx(auVar54,auVar95);
        auVar35 = vorps_avx(auVar54,auVar14);
        auVar78 = vcvtdq2ps_avx(auVar148);
        auVar96._8_4_ = 0x3f3504f3;
        auVar96._0_8_ = 0x3f3504f33f3504f3;
        auVar96._12_4_ = 0x3f3504f3;
        auVar148 = vcmpps_avx(auVar35,auVar96,1);
        auVar54 = vandps_avx(auVar148,auVar35);
        auVar57._0_4_ = auVar35._0_4_ + -1.0 + auVar54._0_4_;
        auVar57._4_4_ = auVar35._4_4_ + -1.0 + auVar54._4_4_;
        auVar57._8_4_ = auVar35._8_4_ + -1.0 + auVar54._8_4_;
        auVar57._12_4_ = auVar35._12_4_ + -1.0 + auVar54._12_4_;
        auVar54 = vandps_avx(auVar148,auVar137);
        auVar148 = vsubps_avx(auVar78,auVar54);
        auVar97._0_4_ = auVar57._0_4_ * auVar57._0_4_;
        auVar97._4_4_ = auVar57._4_4_ * auVar57._4_4_;
        auVar97._8_4_ = auVar57._8_4_ * auVar57._8_4_;
        auVar97._12_4_ = auVar57._12_4_ * auVar57._12_4_;
        auVar108._8_4_ = 0x3d9021bb;
        auVar108._0_8_ = 0x3d9021bb3d9021bb;
        auVar108._12_4_ = 0x3d9021bb;
        auVar119._8_4_ = 0xbdebd1b8;
        auVar119._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar119._12_4_ = 0xbdebd1b8;
        auVar54 = vfmadd213ps_fma(auVar108,auVar57,auVar119);
        auVar120._8_4_ = 0x3def251a;
        auVar120._0_8_ = 0x3def251a3def251a;
        auVar120._12_4_ = 0x3def251a;
        auVar54 = vfmadd213ps_fma(auVar54,auVar57,auVar120);
        auVar121._8_4_ = 0xbdfe5d4f;
        auVar121._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar121._12_4_ = 0xbdfe5d4f;
        auVar54 = vfmadd213ps_fma(auVar54,auVar57,auVar121);
        auVar122._8_4_ = 0x3e11e9bf;
        auVar122._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar122._12_4_ = 0x3e11e9bf;
        auVar54 = vfmadd213ps_fma(auVar54,auVar57,auVar122);
        auVar123._8_4_ = 0xbe2aae50;
        auVar123._0_8_ = 0xbe2aae50be2aae50;
        auVar123._12_4_ = 0xbe2aae50;
        auVar54 = vfmadd213ps_fma(auVar54,auVar57,auVar123);
        auVar124._8_4_ = 0x3e4cceac;
        auVar124._0_8_ = 0x3e4cceac3e4cceac;
        auVar124._12_4_ = 0x3e4cceac;
        auVar54 = vfmadd213ps_fma(auVar54,auVar57,auVar124);
        auVar125._8_4_ = 0xbe7ffffc;
        auVar125._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar125._12_4_ = 0xbe7ffffc;
        auVar54 = vfmadd213ps_fma(auVar54,auVar57,auVar125);
        auVar126._8_4_ = 0x3eaaaaaa;
        auVar126._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar126._12_4_ = 0x3eaaaaaa;
        auVar54 = vfmadd213ps_fma(auVar54,auVar57,auVar126);
        auVar109._0_4_ = auVar97._0_4_ * auVar57._0_4_ * auVar54._0_4_;
        auVar109._4_4_ = auVar97._4_4_ * auVar57._4_4_ * auVar54._4_4_;
        auVar109._8_4_ = auVar97._8_4_ * auVar57._8_4_ * auVar54._8_4_;
        auVar109._12_4_ = auVar97._12_4_ * auVar57._12_4_ * auVar54._12_4_;
        auVar118._8_4_ = 0x3c088908;
        auVar118._0_8_ = 0x3c0889083c088908;
        auVar118._12_4_ = 0x3c088908;
        auVar54 = vfmadd231ps_fma(auVar109,auVar148,auVar164);
        auVar78 = vfmsub231ps_fma(auVar54,auVar14,auVar97);
        auVar54 = vcmpps_avx(auVar150,_DAT_0059ac10,2);
        auVar78 = vsubps_avx(auVar78,auVar57);
        auVar107._8_4_ = 0x39506967;
        auVar107._0_8_ = 0x3950696739506967;
        auVar107._12_4_ = 0x39506967;
        auVar148 = vfnmadd231ps_fma(auVar78,auVar174,auVar148);
        auVar58._0_4_ = auVar148._0_4_ + auVar148._0_4_;
        auVar58._4_4_ = auVar148._4_4_ + auVar148._4_4_;
        auVar58._8_4_ = auVar148._8_4_ + auVar148._8_4_;
        auVar58._12_4_ = auVar148._12_4_ + auVar148._12_4_;
        auVar82._8_4_ = 0x7fffffff;
        auVar82._0_8_ = 0x7fffffff7fffffff;
        auVar82._12_4_ = 0x7fffffff;
        auVar54 = vblendvps_avx(auVar58,auVar82,auVar54);
        auVar54 = vminps_avx(auVar152,auVar54);
        auVar78 = vmaxps_avx(auVar156,auVar54);
        auVar54 = vfmadd213ps_fma(auVar180,auVar78,auVar14);
        auVar83._0_4_ = (int)auVar54._0_4_;
        auVar83._4_4_ = (int)auVar54._4_4_;
        auVar83._8_4_ = (int)auVar54._8_4_;
        auVar83._12_4_ = (int)auVar54._12_4_;
        auVar148 = vcvtdq2ps_avx(auVar83);
        auVar54 = vcmpps_avx(auVar54,auVar148,1);
        auVar54 = vandps_avx(auVar54,auVar137);
        auVar54 = vsubps_avx(auVar148,auVar54);
        auVar148 = vfmsub231ps_fma(auVar78,auVar54,auVar174);
        auVar78 = vfnmsub231ps_fma(auVar148,auVar54,auVar164);
        auVar84._0_4_ = auVar78._0_4_ * auVar78._0_4_;
        auVar84._4_4_ = auVar78._4_4_ * auVar78._4_4_;
        auVar84._8_4_ = auVar78._8_4_ * auVar78._8_4_;
        auVar84._12_4_ = auVar78._12_4_ * auVar78._12_4_;
        auVar148 = vfmadd213ps_fma(auVar107,auVar78,auVar142);
        auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar118);
        auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar171);
        auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar166);
        auVar148 = vfmadd213ps_fma(auVar148,auVar78,auVar14);
        auVar148 = vfmadd213ps_fma(auVar148,auVar84,auVar78);
        auVar40._0_4_ = auVar148._0_4_ + 1.0;
        auVar40._4_4_ = auVar148._4_4_ + 1.0;
        auVar40._8_4_ = auVar148._8_4_ + 1.0;
        auVar40._12_4_ = auVar148._12_4_ + 1.0;
        auVar59._0_4_ = (int)auVar54._0_4_;
        auVar59._4_4_ = (int)auVar54._4_4_;
        auVar59._8_4_ = (int)auVar54._8_4_;
        auVar59._12_4_ = (int)auVar54._12_4_;
        auVar54 = vpslld_avx(auVar59,0x17);
        auVar54 = vpaddd_avx(auVar54,auVar137);
        auVar148 = vfmadd213ps_fma(auVar54,auVar40,auVar137);
        auVar54 = vrcpps_avx(auVar148);
        auVar85._0_4_ = auVar54._0_4_ + auVar54._0_4_;
        auVar85._4_4_ = auVar54._4_4_ + auVar54._4_4_;
        auVar85._8_4_ = auVar54._8_4_ + auVar54._8_4_;
        auVar85._12_4_ = auVar54._12_4_ + auVar54._12_4_;
        auVar15._8_4_ = 0x40000000;
        auVar15._0_8_ = 0x4000000040000000;
        auVar15._12_4_ = 0x40000000;
        auVar148 = vfmsub213ps_fma(auVar148,auVar85,auVar15);
        auVar54 = vfnmadd213ps_fma(auVar148,auVar54,auVar85);
        auVar37 = vfmsub213ps_fma(auVar54,auVar37,auVar37);
        *(undefined1 (*) [16])*pauVar11 = auVar37;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        uVar6 = uVar8 + 7;
        uVar8 = uVar8 + 4;
      }
      if (uVar9 - uVar8 != 0 && (int)uVar8 <= (int)uVar9) {
        lVar12 = 0;
        do {
          __x = *(float *)(*pauVar11 + lVar12 * 4);
          fVar13 = expf(__x);
          fVar13 = logf(fVar13 + 1.0);
          fVar13 = tanhf(fVar13);
          *(float *)(*pauVar11 + lVar12 * 4) = fVar13 * __x;
          lVar12 = lVar12 + 1;
        } while (uVar9 - uVar8 != (int)lVar12);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar10);
  }
  return 0;
}

Assistant:

int Mish_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}